

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void MultiplicationHelper<long_long,_unsigned_long,_15>::
     MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (int64_t *t,uint64_t *u,longlong *ret)

{
  undefined8 *in_RDX;
  int64_t *unaff_retaddr;
  int64_t tmp;
  uint64_t u1;
  int64_t t1;
  
  LargeIntRegMultiply<long,_unsigned_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((int64_t *)u1,(uint64_t *)tmp,unaff_retaddr);
  *in_RDX = 0;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY static void MultiplyThrow( const std::int64_t& t, const std::uint64_t& u, T& ret ) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<T>::isInt64 && safeint_internal::int_traits<U>::isUint64, "T must be Int64, U Uint64");
        std::int64_t t1 = t;
        std::uint64_t u1 = u;
        std::int64_t tmp = 0;
        LargeIntRegMultiply< std::int64_t, std::uint64_t >::template RegMultiplyThrow< E >( t1, u1, &tmp );
        ret = tmp;
    }